

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O0

void __thiscall
CoreML::NeuralNetworkShaper::shapeSequenceRepeatLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  size_t sVar1;
  ShapeConstraint *pSVar2;
  string *psVar3;
  mapped_type *this_00;
  SequenceRepeatLayerParams *this_01;
  ShapeRange *pSVar4;
  ShapeRange local_50;
  size_t local_30;
  size_t nout;
  ShapeConstraint *outputShape;
  ShapeConstraint *inputShape;
  NeuralNetworkLayer *specLayer_local;
  NeuralNetworkShaper *this_local;
  
  inputShape = (ShapeConstraint *)specLayer;
  specLayer_local = (NeuralNetworkLayer *)this;
  psVar3 = Specification::NeuralNetworkLayer::input_abi_cxx11_(specLayer,0);
  outputShape = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
                ::operator[](&this->blobShapes,psVar3);
  psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_((NeuralNetworkLayer *)inputShape,0);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,psVar3);
  nout = (size_t)this_00;
  psVar3 = Specification::NeuralNetworkLayer::output_abi_cxx11_((NeuralNetworkLayer *)inputShape,0);
  ShapeConstraint::setName(this_00,psVar3);
  this_01 = Specification::NeuralNetworkLayer::sequencerepeat((NeuralNetworkLayer *)inputShape);
  local_30 = Specification::SequenceRepeatLayerParams::nrepetitions(this_01);
  sVar1 = nout;
  pSVar4 = ShapeConstraint::sequenceRange(outputShape);
  ShapeRange::operator*(&local_50,pSVar4,local_30);
  ShapeConstraint::updateSequenceRange((ShapeConstraint *)sVar1,&local_50);
  sVar1 = nout;
  pSVar4 = ShapeConstraint::batchRange(outputShape);
  ShapeConstraint::updateBatchRange((ShapeConstraint *)sVar1,pSVar4);
  sVar1 = nout;
  pSVar4 = ShapeConstraint::channelRange(outputShape);
  ShapeConstraint::updateChannelRange((ShapeConstraint *)sVar1,pSVar4);
  sVar1 = nout;
  pSVar4 = ShapeConstraint::heightRange(outputShape);
  ShapeConstraint::updateHeightRange((ShapeConstraint *)sVar1,pSVar4);
  sVar1 = nout;
  pSVar4 = ShapeConstraint::widthRange(outputShape);
  ShapeConstraint::updateWidthRange((ShapeConstraint *)sVar1,pSVar4);
  pSVar2 = outputShape;
  pSVar4 = ShapeConstraint::batchRange((ShapeConstraint *)nout);
  ShapeConstraint::updateBatchRange(pSVar2,pSVar4);
  pSVar2 = outputShape;
  pSVar4 = ShapeConstraint::channelRange((ShapeConstraint *)nout);
  ShapeConstraint::updateChannelRange(pSVar2,pSVar4);
  pSVar2 = outputShape;
  pSVar4 = ShapeConstraint::heightRange((ShapeConstraint *)nout);
  ShapeConstraint::updateHeightRange(pSVar2,pSVar4);
  pSVar2 = outputShape;
  pSVar4 = ShapeConstraint::widthRange((ShapeConstraint *)nout);
  ShapeConstraint::updateWidthRange(pSVar2,pSVar4);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeSequenceRepeatLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Sequence Repeat layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Sequence Repeat layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

    size_t nout = (size_t)specLayer.sequencerepeat().nrepetitions();
    outputShape.updateSequenceRange(inputShape.sequenceRange() * nout);
    outputShape.updateBatchRange(inputShape.batchRange());
    outputShape.updateChannelRange(inputShape.channelRange());
    outputShape.updateHeightRange(inputShape.heightRange());
    outputShape.updateWidthRange(inputShape.widthRange());

    // Pass constraints back up as well
    inputShape.updateBatchRange(outputShape.batchRange());
    inputShape.updateChannelRange(outputShape.channelRange());
    inputShape.updateHeightRange(outputShape.heightRange());
    inputShape.updateWidthRange(outputShape.widthRange());

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Sequence Repeat layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Sequence Repeat layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}